

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfUsedWrongTextureIdDuringTextureRendering_Test::TestBody
          (SDLGraphicsSystemWithLoadedTexture_throwIfUsedWrongTextureIdDuringTextureRendering_Test
           *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_90;
  Message local_88 [2];
  runtime_error *anon_var_0;
  type e;
  byte local_45;
  bool gtest_caught_expected;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  SDLGraphicsSystemWithLoadedTexture_throwIfUsedWrongTextureIdDuringTextureRendering_Test
  *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    local_45 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TextureId::TextureId
                ((TextureId *)((long)&e + 4),(TextureId *)&(anonymous_namespace)::textureId1);
      SDLGraphicsSystem::renderTexture
                (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                  super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system,
                 (TextureId *)((long)&e + 4),(Position *)&(anonymous_namespace)::texturePosition,
                 (Area *)(anonymous_namespace)::textureArea);
    }
    if ((local_45 & 1) != 0) goto LAB_002d5b84;
    std::__cxx11::string::operator=
              ((string *)auStack_38,
               "Expected: system.renderTexture(textureId1, texturePosition, textureArea) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_88);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x152,message);
  testing::internal::AssertHelper::operator=(&local_90,local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  testing::Message::~Message(local_88);
LAB_002d5b84:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfUsedWrongTextureIdDuringTextureRendering)
{
    EXPECT_THROW(
        system.renderTexture(textureId1, texturePosition, textureArea),
        std::runtime_error
    );

    expectQuitSystemWithLoadedTexture();
}